

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O3

bool __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::validate<false>
          (InputParameter<0UL,_ruckig::StandardVector> *this,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  size_t sVar6;
  byte bVar7;
  ControlInterface *pCVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  
  sVar6 = this->degrees_of_freedom;
  if (sVar6 != 0) {
    lVar10 = 0;
    sVar9 = sVar6;
    do {
      dVar1 = *(double *)
               ((long)(this->max_jerk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar10 * 2);
      if ((dVar1 < 0.0) ||
         (dVar2 = *(double *)
                   ((long)(this->max_acceleration).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar10 * 2), dVar2 < 0.0))
      goto LAB_0010d4e2;
      if (((this->min_acceleration).
           super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>.
           _M_payload.
           super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
           .super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>._M_engaged &
          1U) == 0) {
        dVar12 = -dVar2;
      }
      else {
        dVar12 = *(double *)
                  (*(long *)&(this->min_acceleration).
                             super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>
                             ._M_payload._M_value.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar10 * 2);
      }
      if (((0.0 < dVar12) ||
          (dVar3 = *(double *)
                    ((long)(this->current_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10 * 2), NAN(dVar3))) ||
         (dVar4 = *(double *)
                   ((long)(this->target_acceleration).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar10 * 2), NAN(dVar4)))
      goto LAB_0010d4e2;
      if (check_current_state_within_limits) {
        if (dVar2 < dVar3) {
          return (bool)0;
        }
        if (dVar3 < dVar12) {
          return (bool)0;
        }
      }
      if (check_target_state_within_limits) {
        if (dVar2 < dVar4) {
          return (bool)0;
        }
        if (dVar4 < dVar12) {
          return (bool)0;
        }
      }
      dVar2 = *(double *)
               ((long)(this->current_velocity).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar10 * 2);
      if ((NAN(dVar2)) ||
         (dVar12 = *(double *)
                    ((long)(this->target_velocity).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10 * 2), NAN(dVar12)))
      goto LAB_0010d4e2;
      pCVar8 = (ControlInterface *)
               (*(long *)&(this->per_dof_control_interface).
                          super__Optional_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                          ._M_impl + lVar10);
      if (((this->per_dof_control_interface).
           super__Optional_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
           ._M_engaged & 1U) == 0) {
        pCVar8 = &this->control_interface;
      }
      if (*pCVar8 == Position) {
        if (((NAN(*(double *)
                   ((long)(this->current_position).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar10 * 2))) ||
            (NAN(*(double *)
                  ((long)(this->target_position).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10 * 2)))) ||
           (dVar5 = *(double *)
                     ((long)(this->max_velocity).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar10 * 2), dVar5 < 0.0))
        goto LAB_0010d4e2;
        if (((this->min_velocity).
             super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
             .super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>._M_engaged
            & 1U) == 0) {
          dVar13 = -dVar5;
        }
        else {
          dVar13 = *(double *)
                    (*(long *)&(this->min_velocity).
                               super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>
                               ._M_payload._M_value.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar10 * 2);
        }
        if (0.0 < dVar13) goto LAB_0010d4e2;
        if (check_current_state_within_limits) {
          if (dVar5 < dVar2) {
            return (bool)0;
          }
          if (dVar2 < dVar13) {
            return (bool)0;
          }
        }
        if (check_target_state_within_limits) {
          if (dVar5 < dVar12) {
            return (bool)0;
          }
          if (dVar12 < dVar13) {
            return (bool)0;
          }
        }
        if (((check_current_state_within_limits) &&
            ((((0.0 < dVar1 && (0.0 < dVar3)) && (dVar5 < (dVar3 * dVar3) / (dVar1 + dVar1) + dVar2)
              ) || (((0.0 < dVar1 && (dVar3 < 0.0)) &&
                    (dVar2 - (dVar3 * dVar3) / (dVar1 + dVar1) < dVar13)))))) ||
           ((check_target_state_within_limits &&
            ((((0.0 < dVar1 && (dVar4 < 0.0)) &&
              (dVar5 < (dVar4 * dVar4) / (dVar1 + dVar1) + dVar12)) ||
             (((0.0 < dVar1 && (0.0 < dVar4)) &&
              (dVar12 - (dVar4 * dVar4) / (dVar1 + dVar1) < dVar13)))))))) goto LAB_0010d4e2;
      }
      lVar10 = lVar10 + 4;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  bVar7 = 1;
  if ((((this->intermediate_positions).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->intermediate_positions).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) && (this->control_interface == Position)) &&
     ((bVar7 = 0,
      (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false &&
      (this->duration_discretization == Continuous)))) {
    if ((this->per_dof_control_interface).
        super__Optional_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>
        ._M_engaged == false) {
      bVar11 = (this->per_dof_synchronization).
               super__Optional_base<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>
               ._M_engaged;
      if (sVar6 == 0 || bVar11 != false) {
        bVar7 = bVar11 ^ 1;
      }
      else {
        lVar10 = 0;
        do {
          bVar11 = ABS((this->max_jerk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10]) == INFINITY;
          bVar7 = !bVar11;
          if (bVar11) {
            return (bool)bVar7;
          }
          bVar11 = sVar6 - 1 != lVar10;
          lVar10 = lVar10 + 1;
        } while (bVar11);
      }
    }
    else {
LAB_0010d4e2:
      bVar7 = 0;
    }
  }
  return (bool)bVar7;
}

Assistant:

bool validate(bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const double jMax = max_jerk[dof];
            if (std::isnan(jMax) || jMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum jerk limit " + std::to_string(jMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMax = max_acceleration[dof];
            if (std::isnan(aMax) || aMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum acceleration limit " + std::to_string(aMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMin = min_acceleration ? min_acceleration.value()[dof] : -max_acceleration[dof];
            if (std::isnan(aMin) || aMin > 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("minimum acceleration limit " + std::to_string(aMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                }
                return false;
            }

            const double a0 = current_acceleration[dof];
            if (std::isnan(a0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double af = target_acceleration[dof];
            if (std::isnan(af)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            if (check_current_state_within_limits) {
                if (a0 > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (a0 < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }
            if (check_target_state_within_limits) {
                if (af > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (af < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }

            const double v0 = current_velocity[dof];
            if (std::isnan(v0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double vf = target_velocity[dof];
            if (std::isnan(vf)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            auto control_interface_ = per_dof_control_interface ? per_dof_control_interface.value()[dof] : control_interface;
            if (control_interface_ == ControlInterface::Position) {
                const double p0 = current_position[dof];
                if (std::isnan(p0)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current position " + std::to_string(p0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }
                const double pf = target_position[dof];
                if (std::isnan(pf)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target position " + std::to_string(pf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }

                const double vMax = max_velocity[dof];
                if (std::isnan(vMax) || vMax < 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("maximum velocity limit " + std::to_string(vMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                    }
                    return false;
                }

                const double vMin = min_velocity ? min_velocity.value()[dof] : -max_velocity[dof];
                if (std::isnan(vMin) || vMin > 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("minimum velocity limit " + std::to_string(vMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                    }
                    return false;
                }

                if (check_current_state_within_limits) {
                    if (v0 > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (v0 < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (vf > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (vf < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }

                if (check_current_state_within_limits) {
                    if (a0 > 0 && jMax > 0 && v_at_a_zero(v0, a0, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, jMax)) + " from the current kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (a0 < 0 && jMax > 0 && v_at_a_zero(v0, a0, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, -jMax)) + " from the current kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (af < 0 && jMax > 0 && v_at_a_zero(vf, af, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, jMax)) + " from the target kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (af > 0 && jMax > 0 && v_at_a_zero(vf, af, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, -jMax)) + " from the target kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
            }
        }

        if (!intermediate_positions.empty() && control_interface == ControlInterface::Position) {
            if (minimum_duration || duration_discretization != DurationDiscretization::Continuous) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate position can not be used together with a global minimum or discrete duration.");
                }
                return false;
            }

            if (per_dof_control_interface || per_dof_synchronization) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate positions can only be used together with the position control interface and a global synchronization.");
                }
                return false;
            }

            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                const double jMax = max_jerk[dof];
                if (std::isinf(jMax)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("infinite jerk limit of DoF " + std::to_string(dof) + " is currently not supported with intermediate positions.");
                    }
                    return false;
                }
            }
        }

        return true;
    }